

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

uint __thiscall
ON_UuidPtrList2::GetUuids(ON_UuidPtrList2 *this,ON_SimpleArray<ON_UUID_struct> *uuid_list)

{
  bool bVar1;
  uint uVar2;
  unordered_map<ON_UUID_struct,_unsigned_long,_ON_UuidList2_Private<unsigned_long>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_unsigned_long>_>_>
  *this_00;
  reference x;
  pair<const_ON_UUID_struct,_unsigned_long> *pair;
  iterator __end1;
  iterator __begin1;
  unordered_map<ON_UUID_struct,_unsigned_long,_ON_UuidList2_Private<unsigned_long>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_unsigned_long>_>_>
  *__range1;
  int i;
  ON_SimpleArray<ON_UUID_struct> *uuid_list_local;
  ON_UuidPtrList2 *this_local;
  
  uVar2 = Count(this);
  ON_SimpleArray<ON_UUID_struct>::Reserve(uuid_list,(ulong)uVar2);
  __range1._4_4_ = 0;
  this_00 = (unordered_map<ON_UUID_struct,_unsigned_long,_ON_UuidList2_Private<unsigned_long>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_unsigned_long>_>_>
             *)std::
               unique_ptr<ON_UuidPtrList2_Private,_std::default_delete<ON_UuidPtrList2_Private>_>::
               operator->(&this->m_private);
  __end1 = std::
           unordered_map<ON_UUID_struct,_unsigned_long,_ON_UuidList2_Private<unsigned_long>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_unsigned_long>_>_>
           ::begin(this_00);
  pair = (pair<const_ON_UUID_struct,_unsigned_long> *)
         std::
         unordered_map<ON_UUID_struct,_unsigned_long,_ON_UuidList2_Private<unsigned_long>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_unsigned_long>_>_>
         ::end(this_00);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_ON_UUID_struct,_unsigned_long>,_true>
                       ,(_Node_iterator_base<std::pair<const_ON_UUID_struct,_unsigned_long>,_true> *
                        )&pair);
    if (!bVar1) break;
    x = std::__detail::_Node_iterator<std::pair<const_ON_UUID_struct,_unsigned_long>,_false,_true>::
        operator*(&__end1);
    ON_SimpleArray<ON_UUID_struct>::Append(uuid_list,&x->first);
    __range1._4_4_ = __range1._4_4_ + 1;
    std::__detail::_Node_iterator<std::pair<const_ON_UUID_struct,_unsigned_long>,_false,_true>::
    operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

unsigned int ON_UuidPtrList2::GetUuids(ON_SimpleArray<ON_UUID>& uuid_list) const
{
  uuid_list.Reserve(Count());

  int i = 0;
  for (const auto& pair : m_private->map)
  {
    uuid_list.Append(pair.first);
    i++;
  }
  return i;
}